

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

bool __thiscall ON_OffsetSurface::SetBaseSurface(ON_OffsetSurface *this,ON_Surface *base_surface)

{
  ON_Surface *pOVar1;
  bool local_19;
  bool rc;
  ON_Surface *base_surface_local;
  ON_OffsetSurface *this_local;
  
  local_19 = false;
  if (this != (ON_OffsetSurface *)base_surface) {
    local_19 = true;
    if (base_surface == (ON_Surface *)0x0) {
      if (((this->m__pSrf != (ON_Surface *)0x0) && (this != (ON_OffsetSurface *)this->m__pSrf)) &&
         (this->m__pSrf != (ON_Surface *)0x0)) {
        (*(this->m__pSrf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      this->m__pSrf = (ON_Surface *)0x0;
      ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,(ON_Surface *)0x0);
      ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,(ON_Surface *)0x0);
    }
    else {
      pOVar1 = BaseSurface(this);
      if (pOVar1 != base_surface) {
        if (((this->m__pSrf != (ON_Surface *)0x0) && (this != (ON_OffsetSurface *)this->m__pSrf)) &&
           (this->m__pSrf != (ON_Surface *)0x0)) {
          (*(this->m__pSrf->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        this->m__pSrf = (ON_Surface *)0x0;
        ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,base_surface);
      }
    }
    pOVar1 = BaseSurface(this);
    ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar1);
  }
  return local_19;
}

Assistant:

bool ON_OffsetSurface::SetBaseSurface(
  const ON_Surface* base_surface
  )
{
  bool rc = false;
  if ( this != base_surface )
  {
    rc = true;
    if ( 0 == base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(0);
      m_offset_function.SetBaseSurface(0);
    }
    else if ( BaseSurface() != base_surface )
    {
      if ( 0 != m__pSrf && this != m__pSrf )
        delete m__pSrf;
      m__pSrf = 0;
      ON_SurfaceProxy::SetProxySurface(base_surface);
    }
    m_offset_function.SetBaseSurface( BaseSurface() );
  }
  return rc;
}